

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  short sVar7;
  int iVar8;
  ImU32 IVar9;
  uint uVar10;
  GetterXsYs<short> *pGVar11;
  TransformerLogLog *pTVar12;
  ImPlotPlot *pIVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  ImPlotContext *pIVar16;
  ImDrawIdx IVar17;
  long lVar18;
  bool bVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  pIVar16 = GImPlot;
  pGVar11 = this->Getter;
  pTVar12 = this->Transformer;
  iVar8 = pGVar11->Count;
  lVar18 = (long)(((pGVar11->Offset + prim + 1) % iVar8 + iVar8) % iVar8) * (long)pGVar11->Stride;
  sVar7 = *(short *)((long)pGVar11->Ys + lVar18);
  dVar21 = log10((double)(int)*(short *)((long)pGVar11->Xs + lVar18) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar16->LogDenX;
  pIVar13 = pIVar16->CurrentPlot;
  dVar3 = (pIVar13->XAxis).Range.Min;
  dVar4 = (pIVar13->XAxis).Range.Max;
  dVar22 = log10((double)(int)sVar7 / pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  iVar8 = pTVar12->YAxis;
  pIVar13 = pIVar16->CurrentPlot;
  dVar5 = pIVar13->YAxis[iVar8].Range.Min;
  fVar25 = (float)((((double)(float)(dVar21 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar13->XAxis).Range.Min) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar8].Min.x);
  fVar26 = (float)((((double)(float)(dVar22 / pIVar16->LogDenY[iVar8]) *
                     (pIVar13->YAxis[iVar8].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar16->My[iVar8] + (double)pIVar16->PixelRange[iVar8].Min.y);
  fVar24 = (this->P1).x;
  fVar27 = (this->P1).y;
  fVar23 = fVar27;
  if (fVar26 <= fVar27) {
    fVar23 = fVar26;
  }
  bVar19 = false;
  if ((fVar23 < (cull_rect->Max).y) &&
     (fVar23 = (float)(-(uint)(fVar26 <= fVar27) & (uint)fVar27 |
                      ~-(uint)(fVar26 <= fVar27) & (uint)fVar26), pfVar1 = &(cull_rect->Min).y,
     bVar19 = false, *pfVar1 <= fVar23 && fVar23 != *pfVar1)) {
    fVar23 = fVar24;
    if (fVar25 <= fVar24) {
      fVar23 = fVar25;
    }
    if (fVar23 < (cull_rect->Max).x) {
      fVar23 = (float)(~-(uint)(fVar25 <= fVar24) & (uint)fVar25 |
                      -(uint)(fVar25 <= fVar24) & (uint)fVar24);
      bVar19 = (cull_rect->Min).x <= fVar23 && fVar23 != (cull_rect->Min).x;
    }
  }
  if (bVar19 != false) {
    fVar23 = this->Weight;
    IVar9 = this->Col;
    IVar6 = *uv;
    fVar24 = fVar25 - fVar24;
    fVar27 = fVar26 - fVar27;
    fVar20 = fVar24 * fVar24 + fVar27 * fVar27;
    if (0.0 < fVar20) {
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar24 = fVar24 * (1.0 / fVar20);
      fVar27 = fVar27 * (1.0 / fVar20);
    }
    fVar23 = fVar23 * 0.5;
    fVar24 = fVar24 * fVar23;
    fVar23 = fVar23 * fVar27;
    pIVar14 = DrawList->_VtxWritePtr;
    (pIVar14->pos).x = (this->P1).x + fVar23;
    (pIVar14->pos).y = (this->P1).y - fVar24;
    pIVar14->uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar9;
    pIVar14[1].pos.x = fVar23 + fVar25;
    pIVar14[1].pos.y = fVar26 - fVar24;
    pIVar14[1].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar9;
    pIVar14[2].pos.x = fVar25 - fVar23;
    pIVar14[2].pos.y = fVar24 + fVar26;
    pIVar14[2].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar9;
    pIVar14[3].pos.x = (this->P1).x - fVar23;
    pIVar14[3].pos.y = fVar24 + (this->P1).y;
    pIVar14[3].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    uVar10 = DrawList->_VtxCurrentIdx;
    pIVar15 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar10;
    *pIVar15 = IVar17;
    pIVar15[1] = IVar17 + 1;
    pIVar15[2] = IVar17 + 2;
    pIVar15[3] = IVar17;
    pIVar15[4] = IVar17 + 2;
    pIVar15[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar15 + 6;
    DrawList->_VtxCurrentIdx = uVar10 + 4;
  }
  IVar6.y = fVar26;
  IVar6.x = fVar25;
  this->P1 = IVar6;
  return bVar19;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }